

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeRepresentation::~IfcShapeRepresentation
          (IfcShapeRepresentation *this)

{
  pointer *ppLVar1;
  void *pvVar2;
  pointer pLVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  *(undefined8 *)&this[-1].super_IfcShapeModel.super_IfcRepresentation.field_0x28 = 0x89a600;
  *(undefined8 *)
   &(this->super_IfcShapeModel).super_IfcRepresentation.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x10 = 0x89a628;
  pvVar2 = *(void **)&this[-1].super_IfcShapeModel.super_IfcRepresentation.field_0x90;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this[-1].super_IfcShapeModel.field_0xa0 - (long)pvVar2);
  }
  pLVar3 = this[-1].super_IfcShapeModel.super_IfcRepresentation.Items.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppLVar1 = (pointer *)
            ((long)&this[-1].super_IfcShapeModel.super_IfcRepresentation.Items.
                    super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                    .
                    super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
  if (pLVar3 != (pointer)ppLVar1) {
    operator_delete(pLVar3,(ulong)((long)&((LazyObject *)*ppLVar1)->id + 1));
  }
  pcVar4 = this[-1].super_IfcShapeModel.super_IfcRepresentation.RepresentationType.ptr._M_dataplus.
           _M_p;
  paVar5 = &this[-1].super_IfcShapeModel.super_IfcRepresentation.RepresentationType.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

IfcShapeRepresentation() : Object("IfcShapeRepresentation") {}